

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

int __thiscall options::value<int>(options *this,char *s)

{
  undefined8 __s;
  mapped_type *pmVar1;
  int local_1e0 [2];
  int v;
  allocator<char> local_1c9;
  key_type local_1c8;
  istringstream local_1a8 [8];
  istringstream ss;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  char *s_local;
  options *this_local;
  
  lock._8_8_ = s;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->m);
  __s = lock._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,(char *)__s,&local_1c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->opts,&local_1c8);
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)pmVar1,_S_in);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::istream::operator>>((istream *)local_1a8,local_1e0);
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return local_1e0[0];
}

Assistant:

inline T value(const char* s) {
		std::unique_lock<std::mutex> lock(m);
		std::istringstream ss{ opts[std::string{s}] };
		T v;
		ss >> v;
		return v;
	}